

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar6;
  string *psVar7;
  LinkClosure *pLVar8;
  string_view sVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  byte local_6c2;
  bool local_665;
  byte local_664;
  byte local_663;
  bool local_64b;
  byte local_64a;
  cmValue local_630;
  cmValue dirs;
  undefined1 local_608 [8];
  string dirVar;
  undefined1 local_5c8 [8];
  string useVar;
  string *li;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  LinkClosure *lc;
  cmAlphaNum local_560;
  cmAlphaNum local_530;
  string local_500;
  string_view local_4e0;
  string_view local_4d0;
  string *local_4c0;
  string_view local_4b8;
  string_view local_4a8;
  undefined1 local_498 [8];
  string d_1;
  string *topSourceDir;
  cmAlphaNum local_450;
  cmAlphaNum local_420;
  string local_3f0;
  string local_3d0;
  cmAlphaNum local_3b0;
  cmAlphaNum local_380;
  string local_350;
  string_view local_330;
  string_view local_320;
  string *local_310;
  string_view local_308;
  string_view local_2f8;
  undefined1 local_2e8 [8];
  string d;
  string *ri;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *topBinaryDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rdirs;
  string local_290;
  string *local_270;
  string *installPrefix;
  string local_260;
  cmValue local_240;
  cmValue stagePath;
  string local_230;
  allocator<char> local_209;
  string local_208;
  cmValue local_1e8;
  cmValue sysrootLink;
  string rootPath;
  string build_rpath;
  string install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool use_relative_build_rpath;
  string targetOutputDir;
  string local_f8;
  string *local_d8;
  string *originToken;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  byte local_7e;
  byte local_7d;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  undefined1 local_78 [2];
  bool use_link_rpath;
  bool use_build_rpath;
  bool use_install_rpath;
  byte local_55;
  bool linking_for_install;
  allocator<char> local_41;
  string local_40;
  byte local_1a;
  byte local_19;
  bool outputRuntime;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool for_install_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *runtimeDirs_local;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_19 = for_install;
  pvStack_18 = runtimeDirs;
  runtimeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  local_64a = 0;
  if (!bVar3) {
    local_64a = std::__cxx11::string::empty();
    local_64a = local_64a ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1a = local_64a & 1;
  local_7a = 0;
  local_7b = 0;
  local_64b = true;
  if ((local_19 & 1) == 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
    local_7b = 1;
    local_64b = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_78);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  local_55 = local_64b;
  local_663 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target,&this->Config);
    local_663 = 0;
    if (bVar3) {
      local_663 = local_55;
    }
  }
  local_7c = local_663 & 1;
  local_664 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    local_664 = 0;
    if (bVar3) {
      local_664 = local_55 ^ 0xff;
    }
  }
  local_7d = local_664 & 1;
  local_a2 = 0;
  local_a3 = 0;
  originToken._6_1_ = 0;
  originToken._5_1_ = 0;
  local_665 = false;
  if (((local_1a & 1) != 0) && (local_665 = false, (local_55 & 1) != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH",&local_a1);
    local_a3 = 1;
    bVar3 = cmMakefile::IsOn(pcVar1,&local_a0);
    local_665 = false;
    if (!bVar3) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      originToken._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"INSTALL_RPATH_USE_LINK_PATH",
                 (allocator<char> *)((long)&originToken + 7));
      originToken._5_1_ = 1;
      local_665 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_c8);
    }
  }
  if ((originToken._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((originToken._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&originToken + 7));
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  local_7e = local_665;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)(targetOutputDir.field_2._M_local_buf + 0xf));
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(targetOutputDir.field_2._M_local_buf + 0xf));
  local_d8 = psVar5;
  cmGeneratorTarget::GetDirectory
            ((string *)local_120,this->Target,&this->Config,RuntimeBinaryArtifact);
  pcVar2 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"BUILD_RPATH_USE_ORIGIN",
             (allocator<char> *)
             ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_148);
  local_6c2 = 0;
  if (bVar3) {
    uVar4 = std::__cxx11::string::empty();
    local_6c2 = 0;
    if ((uVar4 & 1) == 0) {
      local_6c2 = std::__cxx11::string::empty();
      local_6c2 = local_6c2 ^ 0xff;
    }
  }
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_121 = local_6c2 & 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&install_rpath.field_2 + 8));
  if ((local_7c & 1) != 0) {
    std::__cxx11::string::string((string *)(build_rpath.field_2._M_local_buf + 8));
    cmGeneratorTarget::GetInstallRPATH
              (this->Target,&this->Config,(string *)(build_rpath.field_2._M_local_buf + 8));
    cmCLI_ExpandListUnique
              ((string *)((long)&build_rpath.field_2 + 8),pvStack_18,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&install_rpath.field_2 + 8));
    std::__cxx11::string::~string((string *)(build_rpath.field_2._M_local_buf + 8));
  }
  if ((local_7d & 1) != 0) {
    std::__cxx11::string::string((string *)(rootPath.field_2._M_local_buf + 8));
    bVar3 = cmGeneratorTarget::GetBuildRPATH
                      (this->Target,&this->Config,(string *)(rootPath.field_2._M_local_buf + 8));
    if (bVar3) {
      cmCLI_ExpandListUnique
                ((string *)((long)&rootPath.field_2 + 8),pvStack_18,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&install_rpath.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)(rootPath.field_2._M_local_buf + 8));
  }
  if (((local_7d & 1) != 0) || ((local_7e & 1) != 0)) {
    std::__cxx11::string::string((string *)&sysrootLink);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"CMAKE_SYSROOT_LINK",&local_209);
    local_1e8 = cmMakefile::GetDefinition(pcVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    bVar3 = cmValue::operator_cast_to_bool(&local_1e8);
    if (bVar3) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_1e8);
      std::__cxx11::string::operator=((string *)&sysrootLink,(string *)psVar5);
    }
    else {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"CMAKE_SYSROOT",
                 (allocator<char> *)((long)&stagePath.Value + 7));
      psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_230);
      std::__cxx11::string::operator=((string *)&sysrootLink,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stagePath.Value + 7));
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"CMAKE_STAGING_PREFIX",
               (allocator<char> *)((long)&installPrefix + 7));
    local_240 = cmMakefile::GetDefinition(pcVar1,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix + 7));
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"CMAKE_INSTALL_PREFIX",(allocator<char> *)((long)&rdirs + 7));
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rdirs + 7));
    local_270 = psVar5;
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&sysrootLink);
    this_00 = GetRuntimeSearchPath_abi_cxx11_(this);
    psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    ri = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&ri);
      if (!bVar3) break;
      d.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      if ((local_7d & 1) == 0) {
        if ((local_7e & 1) != 0) {
          d_1.field_2._8_8_ = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
          bVar3 = cmsys::SystemTools::ComparePath
                            ((string *)d.field_2._8_8_,(string *)d_1.field_2._8_8_);
          if (!bVar3) {
            bVar3 = cmsys::SystemTools::ComparePath((string *)d.field_2._8_8_,psVar5);
            if (!bVar3) {
              bVar3 = cmsys::SystemTools::IsSubDirectory
                                ((string *)d.field_2._8_8_,(string *)d_1.field_2._8_8_);
              if (!bVar3) {
                bVar3 = cmsys::SystemTools::IsSubDirectory((string *)d.field_2._8_8_,psVar5);
                if (!bVar3) {
                  std::__cxx11::string::string((string *)local_498,(string *)d.field_2._8_8_);
                  uVar6 = std::__cxx11::string::empty();
                  if ((uVar6 & 1) == 0) {
                    sVar9 = (string_view)
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)local_498);
                    local_4a8 = sVar9;
                    sVar9 = (string_view)
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)&sysrootLink);
                    local_4b8 = sVar9;
                    bVar3 = cmHasPrefix(local_4a8,sVar9);
                    if (!bVar3) goto LAB_005dcfe5;
                    std::__cxx11::string::size();
                    std::__cxx11::string::erase((ulong)local_498,0);
                  }
                  else {
LAB_005dcfe5:
                    local_4c0 = local_240.Value;
                    bVar3 = cmNonempty(local_240);
                    if (bVar3) {
                      sVar9 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)local_498);
                      local_4d0 = sVar9;
                      psVar7 = cmValue::operator*[abi_cxx11_(&local_240);
                      sVar9 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)psVar7);
                      local_4e0 = sVar9;
                      bVar3 = cmHasPrefix(local_4d0,sVar9);
                      if (bVar3) {
                        cmValue::operator*[abi_cxx11_(&local_240);
                        std::__cxx11::string::size();
                        std::__cxx11::string::erase((ulong)local_498,0);
                        cmAlphaNum::cmAlphaNum(&local_530,local_270);
                        cmAlphaNum::cmAlphaNum(&local_560,'/');
                        cmStrCat<std::__cxx11::string>
                                  (&local_500,&local_530,&local_560,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_498);
                        std::__cxx11::string::operator=((string *)local_498,(string *)&local_500);
                        std::__cxx11::string::~string((string *)&local_500);
                        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_498);
                      }
                    }
                  }
                  pVar10 = std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&install_rpath.field_2 + 8),(value_type *)local_498);
                  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(pvStack_18,(value_type *)local_498);
                  }
                  std::__cxx11::string::~string((string *)local_498);
                }
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)local_2e8,(string *)d.field_2._8_8_);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          sVar9 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2e8);
          local_2f8 = sVar9;
          sVar9 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&sysrootLink);
          local_308 = sVar9;
          bVar3 = cmHasPrefix(local_2f8,sVar9);
          if (!bVar3) goto LAB_005dcb1d;
          std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)local_2e8,0);
        }
        else {
LAB_005dcb1d:
          local_310 = local_240.Value;
          bVar3 = cmNonempty(local_240);
          if (bVar3) {
            sVar9 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2e8);
            local_320 = sVar9;
            psVar7 = cmValue::operator*[abi_cxx11_(&local_240);
            sVar9 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
            local_330 = sVar9;
            bVar3 = cmHasPrefix(local_320,sVar9);
            if (bVar3) {
              cmValue::operator*[abi_cxx11_(&local_240);
              std::__cxx11::string::size();
              std::__cxx11::string::erase((ulong)local_2e8,0);
              cmAlphaNum::cmAlphaNum(&local_380,local_270);
              cmAlphaNum::cmAlphaNum(&local_3b0,'/');
              cmStrCat<std::__cxx11::string>
                        (&local_350,&local_380,&local_3b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8);
              std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_350);
              std::__cxx11::string::~string((string *)&local_350);
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_2e8);
              goto LAB_005dcdac;
            }
          }
          if ((local_121 & 1) != 0) {
            bVar3 = cmsys::SystemTools::ComparePath((string *)local_2e8,psVar5);
            if (!bVar3) {
              bVar3 = cmsys::SystemTools::IsSubDirectory((string *)local_2e8,psVar5);
              if (!bVar3) goto LAB_005dcdac;
            }
            cmSystemTools::RelativePath(&local_3d0,(string *)local_120,(string *)local_2e8);
            std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_3d0);
            std::__cxx11::string::~string((string *)&local_3d0);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              cmAlphaNum::cmAlphaNum(&local_420,local_d8);
              cmAlphaNum::cmAlphaNum(&local_450,"/");
              cmStrCat<std::__cxx11::string>
                        (&local_3f0,&local_420,&local_450,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8);
              std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_3f0);
              std::__cxx11::string::~string((string *)&local_3f0);
            }
            else {
              std::__cxx11::string::operator=((string *)local_2e8,(string *)local_d8);
            }
          }
        }
LAB_005dcdac:
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&install_rpath.field_2 + 8),(value_type *)local_2e8);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_18,(value_type *)local_2e8);
        }
        std::__cxx11::string::~string((string *)local_2e8);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&sysrootLink);
  }
  pLVar8 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pLVar8->Languages);
  li = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pLVar8->Languages);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&li);
    if (!bVar3) break;
    useVar.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   useVar.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)(dirVar.field_2._M_local_buf + 8));
    bVar3 = cmMakefile::IsOn(this->Makefile,(string *)local_5c8);
    if (bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              useVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&dirs);
      local_630 = cmMakefile::GetDefinition(this->Makefile,(string *)local_608);
      bVar3 = cmValue::operator_cast_to_bool(&local_630);
      if (bVar3) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_630);
        cmCLI_ExpandListUnique
                  (psVar5,pvStack_18,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&install_rpath.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)local_608);
    }
    std::__cxx11::string::~string((string *)local_5c8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmCLI_ExpandListUnique
            (&this->RuntimeAlways,pvStack_18,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&install_rpath.field_2 + 8));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&install_rpath.field_2 + 8));
  std::__cxx11::string::~string((string *)local_120);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}